

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O2

void __thiscall
MADPComponentDiscreteActions::AddAction
          (MADPComponentDiscreteActions *this,Index AI,string *name,string *description)

{
  pointer puVar1;
  unsigned_long uVar2;
  ostream *poVar3;
  E *this_00;
  ulong uVar4;
  ulong uVar5;
  vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> thisAgentsActions;
  stringstream ss;
  ostream local_1a0 [376];
  
  puVar1 = (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (ulong)AI;
  uVar4 = (long)(this->_m_nrActions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  if (uVar4 == uVar5) {
    _ss = (_func_int **)0x1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&this->_m_nrActions,(unsigned_long *)&ss);
    thisAgentsActions.super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    thisAgentsActions.super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    thisAgentsActions.super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ActionDiscrete::ActionDiscrete((ActionDiscrete *)&ss,0,name,description);
    std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::push_back
              (&thisAgentsActions,(value_type *)&ss);
    std::
    vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
    ::push_back(&this->_m_actionVecs,&thisAgentsActions);
    NamedDescribedEntity::~NamedDescribedEntity((NamedDescribedEntity *)&ss);
    std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::~vector(&thisAgentsActions);
  }
  else {
    if (uVar4 != AI + 1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar3 = std::operator<<(local_1a0,"MADPComponentDiscreteActions::AddAction(");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = std::operator<<(poVar3,(string *)name);
      poVar3 = std::operator<<(poVar3,") - error, actions of agents should be specified in order!");
      poVar3 = std::operator<<(poVar3," first all actions of agent 1, then all of agent 2,...etc..."
                              );
      poVar3 = std::operator<<(poVar3," _m_nrActions.size now is: ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,"\n(the vector _m_nrActions should contain entries for all ");
      std::operator<<(poVar3,"preceeding agents.)");
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,&ss);
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    uVar2 = puVar1[uVar5];
    puVar1[uVar5] = uVar2 + 1;
    ActionDiscrete::ActionDiscrete((ActionDiscrete *)&ss,(Index)uVar2,name,description);
    std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::push_back
              ((this->_m_actionVecs).
               super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar5,(ActionDiscrete *)&ss);
    NamedDescribedEntity::~NamedDescribedEntity((NamedDescribedEntity *)&ss);
  }
  return;
}

Assistant:

void MADPComponentDiscreteActions::AddAction(Index AI,
                                             const string &name,
                                             const string &description)
{
    if(DEBUG_ADD_DA)
        cerr <<  "MADPComponentDiscreteActions::AddAction("<<AI<<","<<name<<")"<<endl;

    if(_m_nrActions.size() != AI && _m_nrActions.size() != AI+1)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteActions::AddAction("<<AI<<","<<name<<
            ") - error, actions of agents should be specified in order!"<<
            " first all actions of agent 1, then all of agent 2,...etc..."<<
            " _m_nrActions.size now is: "<< _m_nrActions.size() <<
            "\n(the vector _m_nrActions should contain entries for all "<<
            "preceeding agents.)";
        throw(E(ss));
    }
    if(_m_nrActions.size() == AI )
    {
        //this is the first action we add for this agent
        _m_nrActions.push_back(1);

        vector<ActionDiscrete> thisAgentsActions;
        ActionDiscrete ad(0, name, description);
        thisAgentsActions.push_back(ad);
        _m_actionVecs.push_back(thisAgentsActions);
    }
    else
    {
        //we add an action for this agent - increment his nr_actions
        Index newActionIndex = _m_nrActions[AI]++;
        ActionDiscrete ad(newActionIndex, name, description);
        _m_actionVecs[AI].push_back(ad);
    }
}